

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O0

void __thiscall xmrig::MinerPrivate::getBackends(MinerPrivate *this,Value *reply,Document *doc)

{
  bool bVar1;
  reference ppIVar2;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *in_RSI;
  long in_RDI;
  IBackend *backend;
  const_iterator __end2;
  const_iterator __begin2;
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *__range2;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *in_stack_ffffffffffffff88;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffff90;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_50;
  IBackend *local_40;
  IBackend **local_38;
  __normal_iterator<xmrig::IBackend_*const_*,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
  local_30;
  long local_28;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_20;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *local_18;
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(in_RDX);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  SetArray(in_stack_ffffffffffffff90);
  local_28 = in_RDI + 0x120;
  local_30._M_current =
       (IBackend **)
       std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::begin
                 (in_stack_ffffffffffffff88);
  local_38 = (IBackend **)
             std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::end
                       (in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<xmrig::IBackend_*const_*,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<xmrig::IBackend_*const_*,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<xmrig::IBackend_*const_*,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
              ::operator*(&local_30);
    local_40 = *ppIVar2;
    in_stack_ffffffffffffff90 = &local_50;
    in_stack_ffffffffffffff88 = local_10;
    (*local_40->_vptr_IBackend[0xd])(in_stack_ffffffffffffff90,local_40,local_18);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack(in_stack_ffffffffffffff90,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)in_stack_ffffffffffffff88,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x231cc4);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_50);
    __gnu_cxx::
    __normal_iterator<xmrig::IBackend_*const_*,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void getBackends(rapidjson::Value &reply, rapidjson::Document &doc) const
    {
        using namespace rapidjson;
        auto &allocator = doc.GetAllocator();

        reply.SetArray();

        for (IBackend *backend : backends) {
            reply.PushBack(backend->toJSON(doc), allocator);
        }
    }